

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O3

ChangeInfo *
capnp::compiler::anon_unknown_0::fieldChangeType
          (ChangeInfo *__return_storage_ptr__,Builder decl,uint *nextOrdinal,bool scopeHasUnion)

{
  WirePointer WVar1;
  uint uVar2;
  int iVar3;
  int *__s1;
  size_t sVar4;
  char *pcVar5;
  bool bVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Reader RVar9;
  Reader value;
  Builder name;
  Builder dval;
  StructBuilder local_108;
  ListElementCount local_e0;
  StructBuilder local_d8;
  StructBuilder local_a8;
  PointerBuilder local_78;
  ListBuilder local_58;
  
  if (*(short *)((long)decl._builder.data + 0xc) == 0) {
    local_108.data = decl._builder.pointers + 5;
    local_108.segment = decl._builder.segment;
    local_108.capTable = decl._builder.capTable;
    capnp::_::PointerBuilder::getStruct
              (&local_a8,(PointerBuilder *)&local_108,(StructSize)0x20003,(word *)0x0);
    if ((short)((WireValue<uint32_t> *)local_a8.data)->value == 9) {
      do {
        uVar2 = rand();
        if ((uVar2 & 1) == 0) {
          *(undefined2 *)&((WireValue<uint32_t> *)local_a8.data)->value = 5;
          local_d8.segment = local_a8.segment;
          local_d8.capTable = local_a8.capTable;
          local_d8.data = local_a8.pointers;
          capnp::_::PointerBuilder::initStruct
                    (&local_108,(PointerBuilder *)&local_d8,(StructSize)0x10001);
        }
        else {
          local_108.data = local_a8.pointers + 1;
          local_108.segment = local_a8.segment;
          local_108.capTable = local_a8.capTable;
          capnp::_::PointerBuilder::getStructList
                    (&local_58,(PointerBuilder *)&local_108,(StructSize)0x20001,(word *)0x0);
          capnp::_::ListBuilder::getStructElement(&local_d8,&local_58,0);
          local_78.pointer = local_d8.pointers + 1;
          local_78.segment = local_d8.segment;
          local_78.capTable = local_d8.capTable;
          capnp::_::PointerBuilder::getStruct(&local_108,&local_78,(StructSize)0x20003,(word *)0x0);
          local_a8.segment = local_108.segment;
          local_a8.capTable = local_108.capTable;
          local_a8.data = local_108.data;
          local_a8.pointers = local_108.pointers;
        }
      } while ((short)((WireValue<uint32_t> *)local_a8.data)->value == 9);
    }
    local_108.segment = local_a8.segment;
    local_108.capTable = local_a8.capTable;
    local_108.data = local_a8.pointers;
    capnp::_::PointerBuilder::getStruct
              (&local_d8,(PointerBuilder *)&local_108,(StructSize)0x10001,(word *)0x0);
    capnp::_::StructBuilder::asReader(&local_d8);
    bVar6 = local_108.pointerCount == 0;
    local_58.ptr = (byte *)local_108.pointers;
    if (bVar6) {
      local_58.ptr = (byte *)(WirePointer *)0x0;
    }
    local_58.elementCount = 0x7fffffff;
    if (!bVar6) {
      local_58.elementCount = local_e0;
    }
    local_58.segment._0_4_ = 0;
    local_58.segment._4_4_ = 0;
    local_58.capTable._0_4_ = 0;
    local_58.capTable._4_4_ = 0;
    if (!bVar6) {
      local_58.segment._0_4_ = local_108.segment._0_4_;
      local_58.segment._4_4_ = local_108.segment._4_4_;
      local_58.capTable._0_4_ = local_108.capTable._0_4_;
      local_58.capTable._4_4_ = local_108.capTable._4_4_;
    }
    RVar9 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_58,(void *)0x0,0);
    if ((RVar9.super_StringPtr.content.size_ - 1 < 4) ||
       (*RVar9.super_StringPtr.content.ptr != 0x74786554)) {
      pcVar5 = "Text";
      sVar4 = 5;
    }
    else {
      pcVar5 = "Int32";
      sVar4 = 6;
    }
    local_108.capTable = local_d8.capTable;
    local_108.segment = local_d8.segment;
    RVar9.super_StringPtr.content.size_ = sVar4;
    RVar9.super_StringPtr.content.ptr = pcVar5;
    capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_108,RVar9);
    __return_storage_ptr__->kind = INCOMPATIBLE;
    kj::heapString(&__return_storage_ptr__->description,0x1b);
    pcVar5 = (char *)(__return_storage_ptr__->description).content.size_;
    if (pcVar5 != (char *)0x0) {
      pcVar5 = (__return_storage_ptr__->description).content.ptr;
    }
    builtin_strncpy(pcVar5 + 0xb,"type of a field.",0x10);
    uVar7._0_1_ = 'h';
    uVar7._1_1_ = 'e';
    uVar7._2_1_ = ' ';
    uVar7._3_1_ = 't';
    uVar8._0_1_ = 'y';
    uVar8._1_1_ = 'p';
    uVar8._2_1_ = 'e';
    uVar8._3_1_ = ' ';
    goto LAB_0010e9ab;
  }
  local_108.data = decl._builder.pointers + 6;
  local_108.segment = decl._builder.segment;
  local_108.capTable = decl._builder.capTable;
  capnp::_::PointerBuilder::getStruct
            (&local_a8,(PointerBuilder *)&local_108,(StructSize)0x20003,(word *)0x0);
  switch((short)((WireValue<uint32_t> *)local_a8.data)->value) {
  case 0:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              ((Fault *)&local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
               ,0x19a,FAILED,(char *)0x0,"\"unknown value expression?\"",
               (char (*) [26])"unknown value expression?");
    kj::_::Debug::Fault::fatal((Fault *)&local_108);
  case 1:
    *(undefined2 *)&((WireValue<uint32_t> *)local_a8.data)->value = 1;
    goto LAB_0010e817;
  case 2:
    *(undefined2 *)&((WireValue<uint32_t> *)local_a8.data)->value = 2;
LAB_0010e817:
    *(byte *)&(((WirePointer *)((long)local_a8.data + 8))->offsetAndKind).value =
         (byte)(((WirePointer *)((long)local_a8.data + 8))->offsetAndKind).value ^ 1;
    break;
  case 3:
    WVar1 = *(WirePointer *)((long)local_a8.data + 8);
    *(undefined2 *)&((WireValue<uint32_t> *)local_a8.data)->value = 3;
    *(ulong *)((long)local_a8.data + 8) = (ulong)WVar1 ^ 0x8000000000000000;
    break;
  case 4:
  case 6:
  case 7:
  case 8:
    __return_storage_ptr__->kind = NO_CHANGE;
    kj::heapString(&__return_storage_ptr__->description,0x3e);
    pcVar5 = (char *)(__return_storage_ptr__->description).content.size_;
    if (pcVar5 != (char *)0x0) {
      pcVar5 = (__return_storage_ptr__->description).content.ptr;
    }
    builtin_strncpy(pcVar5 + 0x10,"lt value of a field, but it\'s a pointer field.",0x2e);
    uVar7._0_1_ = 'h';
    uVar7._1_1_ = 'e';
    uVar7._2_1_ = ' ';
    uVar7._3_1_ = 'd';
    uVar8._0_1_ = 'e';
    uVar8._1_1_ = 'f';
    uVar8._2_1_ = 'a';
    uVar8._3_1_ = 'u';
    goto LAB_0010e9ab;
  case 5:
    local_108.segment = local_a8.segment;
    local_108.capTable = local_a8.capTable;
    local_108.data = local_a8.pointers;
    capnp::_::PointerBuilder::getStruct
              (&local_d8,(PointerBuilder *)&local_108,(StructSize)0x10001,(word *)0x0);
    capnp::_::StructBuilder::asReader(&local_d8);
    bVar6 = local_108.pointerCount == 0;
    local_58.ptr = (byte *)local_108.pointers;
    if (bVar6) {
      local_58.ptr = (byte *)(WirePointer *)0x0;
    }
    local_58.elementCount = 0x7fffffff;
    if (!bVar6) {
      local_58.elementCount = local_e0;
    }
    local_58.segment._0_4_ = 0;
    local_58.segment._4_4_ = 0;
    local_58.capTable._0_4_ = 0;
    local_58.capTable._4_4_ = 0;
    if (!bVar6) {
      local_58.segment._0_4_ = local_108.segment._0_4_;
      local_58.segment._4_4_ = local_108.segment._4_4_;
      local_58.capTable._0_4_ = local_108.capTable._0_4_;
      local_58.capTable._4_4_ = local_108.capTable._4_4_;
    }
    RVar9 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_58,(void *)0x0,0);
    sVar4 = RVar9.super_StringPtr.content.size_;
    __s1 = RVar9.super_StringPtr.content.ptr;
    if (sVar4 == 4) {
      iVar3 = bcmp(__s1,"foo",4);
      if (iVar3 != 0) goto LAB_0010e946;
      local_108.data = local_d8.pointers;
      local_108.segment = local_d8.segment;
      local_108.capTable = local_d8.capTable;
      pcVar5 = "bar";
LAB_0010e963:
      sVar4 = 4;
    }
    else if (sVar4 == 6) {
      iVar3 = bcmp(__s1,"false",6);
      if (iVar3 != 0) goto LAB_0010e946;
      local_108.segment = local_d8.segment;
      local_108.capTable = local_d8.capTable;
      local_108.data = local_d8.pointers;
      pcVar5 = "true";
      sVar4 = 5;
    }
    else {
      if ((sVar4 != 5) || ((char)__s1[1] != '\0' || *__s1 != 0x65757274)) {
LAB_0010e946:
        local_108.segment = local_d8.segment;
        local_108.capTable = local_d8.capTable;
        local_108.data = local_d8.pointers;
        pcVar5 = "foo";
        goto LAB_0010e963;
      }
      local_108.segment = local_d8.segment;
      local_108.capTable = local_d8.capTable;
      local_108.data = local_d8.pointers;
      pcVar5 = "false";
      sVar4 = 6;
    }
    value.super_StringPtr.content.size_ = sVar4;
    value.super_StringPtr.content.ptr = pcVar5;
    capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_108,value);
    break;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[28]>
              ((Fault *)&local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
               ,0x1b7,FAILED,(char *)0x0,"\"Unexpected expression type.\"",
               (char (*) [28])"Unexpected expression type.");
    kj::_::Debug::Fault::fatal((Fault *)&local_108);
  }
  __return_storage_ptr__->kind = INCOMPATIBLE;
  kj::heapString(&__return_storage_ptr__->description,0x2e);
  pcVar5 = (char *)(__return_storage_ptr__->description).content.size_;
  if (pcVar5 != (char *)0x0) {
    pcVar5 = (__return_storage_ptr__->description).content.ptr;
  }
  builtin_strncpy(pcVar5 + 0x10,"lt value of a pritimive field.",0x1e);
  uVar7._0_1_ = 'h';
  uVar7._1_1_ = 'e';
  uVar7._2_1_ = ' ';
  uVar7._3_1_ = 'd';
  uVar8._0_1_ = 'e';
  uVar8._1_1_ = 'f';
  uVar8._2_1_ = 'a';
  uVar8._3_1_ = 'u';
LAB_0010e9ab:
  pcVar5[0] = 'C';
  pcVar5[1] = 'h';
  pcVar5[2] = 'a';
  pcVar5[3] = 'n';
  pcVar5[4] = 'g';
  pcVar5[5] = 'e';
  pcVar5[6] = ' ';
  pcVar5[7] = 't';
  *(undefined4 *)(pcVar5 + 8) = uVar7;
  *(undefined4 *)(pcVar5 + 0xc) = uVar8;
  return __return_storage_ptr__;
}

Assistant:

static ChangeInfo fieldChangeType(Declaration::Builder decl, uint& nextOrdinal,
                                  bool scopeHasUnion) {
  auto field = decl.getField();

  if (field.getDefaultValue().isNone()) {
    // Change the type.
    auto type = field.getType();
    while (type.isApplication()) {
      // Either change the list parameter, or revert to a non-list.
      if (rand() % 2) {
        type = type.getApplication().getParams()[0].getValue();
      } else {
        type.initRelativeName();
      }
    }
    auto typeName = type.getRelativeName();
    if (typeName.asReader().getValue().startsWith("Text")) {
      typeName.setValue("Int32");
    } else {
      typeName.setValue("Text");
    }
    return { INCOMPATIBLE, "Change the type of a field." };
  } else {
    // Change the default value.
    auto dval = field.getDefaultValue().getValue();
    switch (dval.which()) {
      case Expression::UNKNOWN: KJ_FAIL_ASSERT("unknown value expression?");
      case Expression::POSITIVE_INT: dval.setPositiveInt(dval.getPositiveInt() ^ 1); break;
      case Expression::NEGATIVE_INT: dval.setNegativeInt(dval.getNegativeInt() ^ 1); break;
      case Expression::FLOAT: dval.setFloat(-dval.getFloat()); break;
      case Expression::RELATIVE_NAME: {
        auto name = dval.getRelativeName();
        auto nameText = name.asReader().getValue();
        if (nameText == "true") {
          name.setValue("false");
        } else if (nameText == "false") {
          name.setValue("true");
        } else if (nameText == "foo") {
          name.setValue("bar");
        } else {
          name.setValue("foo");
        }
        break;
      }
      case Expression::STRING:
      case Expression::BINARY:
      case Expression::LIST:
      case Expression::TUPLE:
        return { NO_CHANGE, "Change the default value of a field, but it's a pointer field." };

      case Expression::ABSOLUTE_NAME:
      case Expression::IMPORT:
      case Expression::EMBED:
      case Expression::APPLICATION:
      case Expression::MEMBER:
        KJ_FAIL_ASSERT("Unexpected expression type.");
    }
    return { INCOMPATIBLE, "Change the default value of a pritimive field." };
  }
}